

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O2

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,
                 monster_conflict *mon)

{
  ushort uVar1;
  char *pcVar2;
  _Bool _Var3;
  _Bool _Var4;
  bool bVar5;
  uint32_t uVar6;
  monster_spell *pmVar7;
  int iVar8;
  effect *peVar9;
  size_t size;
  bitflag *flags_00;
  timed_failure *ptVar10;
  mon_spell_info *pmVar11;
  int local_64;
  bitflag backup [13];
  
  _Var3 = monster_is_smart((monster *)mon);
  flag_wipe(backup,0xd);
  pmVar11 = mon_spell_types;
  local_64 = 100;
  do {
    uVar1 = pmVar11->index;
    if (0x60 < uVar1) {
      iVar8 = flag_count(spells,0xd);
      if ((_Var3) && (uVar6 = Rand_div(iVar8 + 1), uVar6 == 0)) {
        pmVar11 = mon_spell_types;
        while( true ) {
          uVar1 = pmVar11->index;
          if (0x60 < uVar1) break;
          pmVar7 = monster_spell_by_index((uint)uVar1);
          if (pmVar7 != (monster_spell *)0x0) {
            _Var3 = flag_has_dbg(backup,0xd,(uint)uVar1,"backup","info->index");
            if ((_Var3) && (100 - el[pmVar7->effect->subtype].res_level == local_64)) {
              flag_on_dbg(spells,0xd,(uint)uVar1,"spells","info->index");
            }
          }
          pmVar11 = pmVar11 + 1;
        }
      }
      return;
    }
    pmVar7 = monster_spell_by_index((uint)uVar1);
    if (pmVar7 != (monster_spell *)0x0) {
      _Var4 = flag_has_dbg(spells,0xd,(uint)uVar1,"spells","info->index");
      if (_Var4) {
        peVar9 = pmVar7->effect;
        if ((pmVar11->type & 7) == 0) {
LAB_0017cf57:
          if (peVar9 != (effect *)0x0) {
            if ((_Var3) || (uVar6 = Rand_div(3), uVar6 != 0)) {
              if (peVar9->index == 10) {
                if (0x34 < (ulong)(uint)peVar9->subtype) {
                  __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-spell.c"
                                ,0x205,
                                "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                               );
                }
                ptVar10 = (timed_failure *)&timed_effects[(uint)peVar9->subtype].fail;
                bVar5 = false;
switchD_0017cfc4_default:
                ptVar10 = ptVar10->next;
                if ((ptVar10 == (timed_failure *)0x0) || (bVar5 != false)) break;
                bVar5 = false;
                switch(ptVar10->code) {
                case 1:
                  iVar8 = ptVar10->idx;
                  size = 6;
                  pcVar2 = "save str flags";
                  flags_00 = flags;
                  break;
                case 2:
                  bVar5 = el[ptVar10->idx].res_level < 0x51;
                  goto switchD_0017cfc4_default;
                case 3:
                  bVar5 = 100 < el[ptVar10->idx].res_level;
                  goto switchD_0017cfc4_default;
                case 4:
                  iVar8 = ptVar10->idx;
                  size = 10;
                  pcVar2 = "p->state.pflags";
                  flags_00 = pflags;
                  break;
                default:
                  goto switchD_0017cfc4_default;
                }
                bVar5 = flag_has_dbg(flags_00,size,iVar8,pcVar2 + 9,"f->idx");
                goto switchD_0017cfc4_default;
              }
              goto LAB_0017d030;
            }
            goto LAB_0017d035;
          }
          goto LAB_0017cf4a;
        }
        iVar8 = 100 - el[peVar9->subtype].res_level;
        if (iVar8 <= local_64 && _Var3) {
          flag_on_dbg(backup,0xd,(uint)uVar1,"backup","info->index");
          local_64 = iVar8;
        }
        uVar6 = Rand_div(100);
        if ((int)uVar6 < iVar8) {
LAB_0017cf3b:
          flag_off(spells,0xd,(uint)uVar1);
        }
      }
    }
LAB_0017cf4a:
    pmVar11 = pmVar11 + 1;
  } while( true );
  if (bVar5 != false) goto LAB_0017cf3b;
LAB_0017d030:
  if (!_Var3) {
LAB_0017d035:
    uVar6 = Rand_div(2);
    if (uVar6 != 0) goto LAB_0017cf53;
  }
  if ((peVar9->index == 0x17) && (_Var4 = flag_has_dbg(pflags,10,0x1d,"pflags","PF_NO_MANA"), _Var4)
     ) goto LAB_0017cf3b;
LAB_0017cf53:
  peVar9 = peVar9->next;
  goto LAB_0017cf57;
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);
	int lowest_resist = RES_LEVEL_BASE;
	bitflag backup[RSF_SIZE];
	int restore_chance = 0;

	rsf_wipe(backup);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int raw_resist = RES_LEVEL_BASE - el[element].res_level;

			/* Smart monsters keep a backup */
			if (smart && (raw_resist <= lowest_resist)) {
				lowest_resist = raw_resist;
				rsf_on(backup, info->index);
			}

			/* High resist means more likely to drop the spell */
			if (randint0(100) < raw_resist) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level <= RES_LEVEL_EFFECT) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level > RES_LEVEL_BASE) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}

	/* Smart monsters re-assess dropped elemental spells */
	restore_chance = 1 + rsf_count(spells);
	if (smart && one_in_(restore_chance)) {
		for (info = mon_spell_types; info->index < RSF_MAX; info++) {
			const struct monster_spell *spell =
				monster_spell_by_index(info->index);
			int element;
			if (!spell) continue;
			if (!rsf_has(backup, info->index)) continue;
			element = spell->effect->subtype;
			if (RES_LEVEL_BASE - el[element].res_level == lowest_resist) {
				rsf_on(spells, info->index);
			}
		}
	}
}